

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O1

void printAddrMode2Operand(MCInst *MI,uint Op,SStream *O)

{
  uint8_t *puVar1;
  cs_struct *pcVar2;
  cs_detail *pcVar3;
  char *pcVar4;
  _Bool _Var5;
  uint uVar6;
  MCOperand *pMVar7;
  MCOperand *op;
  MCOperand *op_00;
  ulong uVar8;
  char *pcVar9;
  int64_t iVar10;
  
  pMVar7 = MCInst_getOperand(MI,Op);
  _Var5 = MCOperand_isReg(pMVar7);
  if (_Var5) {
    pMVar7 = MCInst_getOperand(MI,Op);
    op = MCInst_getOperand(MI,Op + 1);
    op_00 = MCInst_getOperand(MI,Op + 2);
    uVar8 = MCOperand_getImm(op_00);
    SStream_concat0(O,"[");
    set_mem_access(MI,true);
    pcVar2 = MI->csh;
    uVar6 = MCOperand_getReg(pMVar7);
    pcVar9 = (*pcVar2->get_regname)(uVar6);
    SStream_concat0(O,pcVar9);
    if (MI->csh->detail != CS_OPT_OFF) {
      uVar6 = MCOperand_getReg(pMVar7);
      pcVar3 = MI->flat_insn->detail;
      *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar6;
    }
    uVar6 = MCOperand_getReg(op);
    if (uVar6 == 0) {
      uVar8 = MCOperand_getImm(op_00);
      uVar6 = (uint)uVar8 & 0xfff;
      if ((uVar8 & 0xfff) != 0) {
        uVar8 = MCOperand_getImm(op_00);
        SStream_concat0(O,", ");
        pcVar9 = "-";
        if ((uVar8 >> 0xc & 1) == 0) {
          pcVar9 = anon_var_dwarf_f210c + 0x11;
        }
        pcVar4 = ", #%s%u";
        if (9 < uVar6) {
          pcVar4 = ", #%s0x%x";
        }
        SStream_concat(O,pcVar4 + 2,pcVar9,(ulong)uVar6);
        if (MI->csh->detail != CS_OPT_OFF) {
          iVar10 = MCOperand_getImm(op_00);
          pcVar3 = MI->flat_insn->detail;
          *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x3a) =
               (uint)(((uint)iVar10 >> 0xc & 1) == 0);
          pcVar3 = MI->flat_insn->detail;
          *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x3e) = uVar6;
          pcVar3 = MI->flat_insn->detail;
          pcVar3->groups[(ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x56] =
               (byte)(uVar8 >> 0xc) & 1;
        }
      }
    }
    else {
      SStream_concat0(O,", ");
      pcVar9 = "-";
      if ((uVar8 >> 0xc & 1) == 0) {
        pcVar9 = anon_var_dwarf_f210c + 0x11;
      }
      SStream_concat0(O,pcVar9);
      pcVar2 = MI->csh;
      uVar6 = MCOperand_getReg(op);
      pcVar9 = (*pcVar2->get_regname)(uVar6);
      SStream_concat0(O,pcVar9);
      if (MI->csh->detail != CS_OPT_OFF) {
        uVar6 = MCOperand_getReg(op);
        pcVar3 = MI->flat_insn->detail;
        *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x4a) = uVar6;
        pcVar3 = MI->flat_insn->detail;
        pcVar3->groups[(ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x56] =
             (byte)(uVar8 >> 0xc) & 1;
      }
      uVar8 = MCOperand_getImm(op_00);
      iVar10 = MCOperand_getImm(op_00);
      printRegImmShift(MI,O,(ARM_AM_ShiftOpc)(uVar8 >> 0xd) & (ARM_AM_ror|ARM_AM_lsr),
                       (uint)iVar10 & 0xfff);
    }
    SStream_concat0(O,"]");
    if (MI->csh->detail == CS_OPT_ON) {
      MI->csh->doing_mem = false;
      puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
      *puVar1 = *puVar1 + '\x01';
    }
    return;
  }
  printOperand(MI,Op,O);
  return;
}

Assistant:

static void printAddrMode2Operand(MCInst *MI, unsigned Op, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, Op);

	if (!MCOperand_isReg(MO1)) {   // FIXME: This is for CP entries, but isn't right.
		printOperand(MI, Op, O);
		return;
	}

	printAM2PreOrOffsetIndexOp(MI, Op, O);
}